

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_xpriv_derive_hardened_Test::Descriptor_xpriv_derive_hardened_Test
          (Descriptor_xpriv_derive_hardened_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006fda90;
  return;
}

Assistant:

TEST(Descriptor, xpriv_derive_hardened) {
  std::string descriptor = "sh(wsh(pkh(xprvA5P4YtgFjzqM4QpXJZ8Zr7Wkhng7ugTybA3KWMAqDfAamqu5nqJ3zKRhB29cxuqCc8hPagZcN5BsuoXx4Xn7iYHnQvEdyMwZRFgoJXs8CDN/0'/44/*')))";
  Descriptor desc;
  Script locking_script;
  DescriptorScriptReference script_ref;
  DescriptorNode node;

  std::vector<std::string> arg_list{"0'/0'"};
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_NO_THROW(script_ref = desc.GetReference(&arg_list));
  EXPECT_STREQ(node.ToString(false).c_str(), descriptor.c_str());
  EXPECT_TRUE(script_ref.HasRedeemScript());
  EXPECT_STREQ(script_ref.GetRedeemScript().ToString().c_str(),
      "0 7b2bb92ed714a0534e2a35442f5e4f2718a77143d74edefca3f9fa72bbca9723");
  EXPECT_TRUE(script_ref.GetChild().HasRedeemScript());
  EXPECT_STREQ(script_ref.GetChild().GetRedeemScript().ToString().c_str(),
      "OP_DUP OP_HASH160 1f030158408c421e09107cc81916f82f470a9df4 OP_EQUALVERIFY OP_CHECKSIG");
  DescriptorScriptReference pkh_ref = script_ref.GetChild().GetChild();
  EXPECT_FALSE(pkh_ref.HasRedeemScript());
  EXPECT_TRUE(pkh_ref.HasKey());
  std::vector<DescriptorKeyReference> keylist = pkh_ref.GetKeyList();
  EXPECT_EQ(keylist.size(), 1);
  if (!keylist.empty()) {
    EXPECT_STREQ(keylist[0].GetExtPrivkey().ToString().c_str(),
        "xprvABvmZt3VZFopkh2oWpe8ndMPU2nA3RahBPVutV6wQQN4rd353GNxoJg9KBsWi5sDompQVHUgJKb1eXYZmPrq7VykUyvxugUrMPWXes9jHSk");
    EXPECT_STREQ(keylist[0].GetExtPubkey().ToString().c_str(),
        "xpub6Qv7yPaPPdN7yB7GcrB99mJ824ceStJYYcRWgsWYxju3jRNDaohDM6zdATtizz9TnE8Ra83b4RQSRcoj95xDsH4eLyb2wappmRy2bPdr28u");
    EXPECT_STREQ(keylist[0].GetPubkey().GetHex().c_str(),
        "0321d3b2d7b0e6c3679dd0ff8f02ec7713e8e6ae502e34692ae1eb247c25dcb7a1");
  }
}